

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O3

MPP_RET allocator_ion_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint __fd;
  RK_S32 RVar4;
  size_t *psVar5;
  FILE *__stream;
  size_t sVar6;
  size_t extraout_RDX;
  size_t max_length;
  size_t extraout_RDX_00;
  size_t max_length_00;
  size_t extraout_RDX_01;
  char *pcVar7;
  long lVar8;
  char path [256];
  int local_13c;
  char local_138 [264];
  
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,"mpp_ion","os_allocator_open Android do not accept NULL input\n",(char *)0x0);
    return MPP_ERR_NULL_PTR;
  }
  *ctx = (void *)0x0;
  __fd = open64("/dev/ion",0x80002);
  if ((int)__fd < 0) {
    _mpp_log_l(2,"mpp_ion","open %s failed!\n",(char *)0x0,"/dev/ion");
    return MPP_ERR_UNKNOW;
  }
  if (((byte)ion_debug & 2) != 0) {
    _mpp_log_l(4,"mpp_ion","open ion dev fd %d\n",(char *)0x0,(ulong)__fd);
  }
  psVar5 = (size_t *)mpp_osal_malloc("allocator_ion_open",0x10);
  if (psVar5 == (size_t *)0x0) {
    close(__fd);
    _mpp_log_l(2,"mpp_ion","os_allocator_open Android failed to allocate context\n",(char *)0x0);
    return MPP_ERR_MALLOC;
  }
  pthread_mutex_lock((pthread_mutex_t *)&lock);
  if (ion_heap_id < 0) {
    lVar8 = 0;
    mpp_env_get_u32("ion_debug",&ion_debug,0);
    max_length_00 = extraout_RDX;
    do {
      builtin_strncpy(local_138,"/proc/device-tree",0x12);
      pcVar7 = *(char **)((long)&check_sysfs_iommu_dts_devices + lVar8);
      RVar4 = find_dir_in_path(local_138,pcVar7,max_length_00);
      max_length_00 = max_length;
      if ((RVar4 != 0) &&
         (RVar4 = find_dir_in_path(local_138,"iommu_enabled",max_length),
         max_length_00 = extraout_RDX_00, RVar4 != 0)) {
        __stream = fopen64(local_138,"rb");
        if (__stream == (FILE *)0x0) {
          pcVar7 = "ION_HEAP_TYPE_DMA";
          RVar4 = 4;
          ion_heap_mask = 0x10;
          goto LAB_0011c4bd;
        }
        local_13c = 0;
        sVar6 = fread(&local_13c,4,1,__stream);
        iVar3 = local_13c;
        if (sVar6 != 0) {
          _mpp_log_l(4,"mpp_ion","%s iommu_enabled %d\n",(char *)0x0,pcVar7,(ulong)(local_13c != 0))
          ;
        }
        fclose(__stream);
        if (iVar3 != 0) goto LAB_0011c48d;
        pcVar7 = "ION_HEAP_TYPE_DMA";
        RVar4 = 4;
        ion_heap_mask = 0x10;
        goto LAB_0011c4bd;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x28);
    lVar8 = 0;
    bVar1 = true;
LAB_0011c2cd:
    builtin_strncpy(local_138 + 0x10,"g/ion/heaps",0xc);
    builtin_strncpy(local_138,"/sys/kernel/debu",0x10);
    pcVar7 = (&check_sysfs_iommu_system_heaps)[lVar8];
    RVar4 = find_dir_in_path(local_138,pcVar7,max_length_00);
    if (RVar4 == 0) goto code_r0x0011c2fc;
    _mpp_log_l(4,"mpp_ion","%s found\n",(char *)0x0,pcVar7);
LAB_0011c48d:
    pcVar7 = "ION_HEAP_TYPE_SYSTEM";
    RVar4 = 0;
    ion_heap_mask = 1;
    goto LAB_0011c4bd;
  }
LAB_0011c4ea:
  pthread_mutex_unlock((pthread_mutex_t *)&lock);
  *psVar5 = alignment;
  *(MppAllocFlagType *)((long)psVar5 + 0xc) = flags;
  *(uint *)(psVar5 + 1) = __fd;
  *ctx = psVar5;
  return MPP_OK;
code_r0x0011c2fc:
  lVar8 = 1;
  bVar2 = !bVar1;
  max_length_00 = extraout_RDX_01;
  bVar1 = false;
  if (bVar2) goto code_r0x0011c30c;
  goto LAB_0011c2cd;
code_r0x0011c30c:
  RVar4 = 2;
  _mpp_log_l(2,"mpp_ion","can not find any hint from all possible devices\n",(char *)0x0);
  pcVar7 = "ION_HEAP_TYPE_CARVEOUT";
  ion_heap_mask = 4;
LAB_0011c4bd:
  ion_heap_id = RVar4;
  _mpp_log_l(4,"mpp_ion","using ion heap %s\n",(char *)0x0,pcVar7);
  goto LAB_0011c4ea;
}

Assistant:

static MPP_RET allocator_ion_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    RK_S32 fd;
    allocator_ctx_ion *p;

    if (NULL == ctx) {
        mpp_err("os_allocator_open Android do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;

    fd = open(dev_ion, O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open %s failed!\n", dev_ion);
        return MPP_ERR_UNKNOW;
    }

    ion_dbg(ION_DEVICE, "open ion dev fd %d\n", fd);

    p = mpp_malloc(allocator_ctx_ion, 1);
    if (NULL == p) {
        close(fd);
        mpp_err("os_allocator_open Android failed to allocate context\n");
        return MPP_ERR_MALLOC;
    } else {
        /*
         * do heap id detection here:
         * if there is no vpu_service use default ION_HEAP_TYPE_SYSTEM_CONTIG
         * if there is vpu_service then check the iommu_enable status
         */
        pthread_mutex_lock(&lock);
        if (ion_heap_id < 0) {
            int detect_result = check_sysfs_iommu();
            const char *heap_name = NULL;

            switch (detect_result) {
            case ION_DETECT_IOMMU_DISABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            case ION_DETECT_IOMMU_ENABLE : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_SYSTEM);
                ion_heap_id     = ION_HEAP_TYPE_SYSTEM;
                heap_name = "ION_HEAP_TYPE_SYSTEM";
            } break;
            case ION_DETECT_NO_DTS : {
                ion_heap_mask   = (1 << ION_HEAP_TYPE_CARVEOUT);
                ion_heap_id     = ION_HEAP_TYPE_CARVEOUT;
                heap_name = "ION_HEAP_TYPE_CARVEOUT";
            } break;
            default : {
                mpp_err("invalid detect result %d\n", detect_result);
                ion_heap_mask   = (1 << ION_HEAP_TYPE_DMA);
                ion_heap_id     = ION_HEAP_TYPE_DMA;
                heap_name = "ION_HEAP_TYPE_DMA";
            } break;
            }
            mpp_log("using ion heap %s\n", heap_name);
        }
        pthread_mutex_unlock(&lock);
        p->alignment    = alignment;
        p->flags        = flags;
        p->ion_device   = fd;
        *ctx = p;
    }

    return MPP_OK;
}